

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void relational_suite::compare_map_with_map_string(void)

{
  size_type in_RCX;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *ppVar1;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_01;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_02;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_03;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_04;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_05;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_06;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_07;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_08;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_09;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_10;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_11;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_12;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_13;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_14;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_15;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_16;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_17;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_18;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_19;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_20;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_21;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_22;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_23;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_24;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_25;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_26;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_27;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_28;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_29;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_30;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1918;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1900;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_18e8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_18d0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_18b8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_18a0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1888;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1870;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1858;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1840;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1828;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1810;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_17f8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_17e0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_17c8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_17b0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1798;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1780;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1768;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1750;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1738;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1720;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1708;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_16f0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_16d8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_16c0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_16a8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1690;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1678;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1660;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1648;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1630;
  undefined1 local_1625;
  int local_1624;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1620;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1618;
  undefined1 local_15b8 [68];
  int local_1574 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1568;
  undefined1 local_1508 [65];
  undefined1 local_14c7 [2];
  undefined1 local_14c5;
  int local_14c4 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_14b8;
  undefined1 local_1458 [68];
  int local_1414 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1408;
  undefined1 local_13a8 [65];
  undefined1 local_1367 [2];
  undefined1 local_1365;
  int local_1364 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1358;
  undefined1 local_12f8 [68];
  int local_12b4 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_12a8;
  undefined1 local_1248 [65];
  undefined1 local_1207 [2];
  undefined1 local_1205;
  int local_1204 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_11f8;
  undefined1 local_1198 [68];
  int local_1154 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1148;
  undefined1 local_10e8 [65];
  undefined1 local_10a7 [2];
  undefined1 local_10a5;
  int local_10a4 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1098;
  undefined1 local_1038 [68];
  int local_ff4 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_fe8;
  undefined1 local_f88 [65];
  undefined1 local_f47 [2];
  undefined1 local_f45;
  int local_f44 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_f38;
  undefined1 local_ed8 [68];
  int local_e94 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_e88;
  undefined1 local_e28 [65];
  undefined1 local_de7 [2];
  undefined1 local_de5;
  int local_de4 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_dd8;
  undefined1 local_d78 [68];
  int local_d34 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_d28;
  undefined1 local_cc8 [65];
  undefined1 local_c87 [2];
  undefined1 local_c85;
  int local_c84 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_c78;
  undefined1 local_c18 [68];
  int local_bd4 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_bc8;
  undefined1 local_b68 [65];
  undefined1 local_b27 [2];
  undefined1 local_b25;
  int local_b24 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_b18;
  undefined1 local_ab8 [68];
  int local_a74 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_a68;
  undefined1 local_a08 [65];
  undefined1 local_9c7 [2];
  undefined1 local_9c5;
  int local_9c4 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_9b8;
  undefined1 local_958 [68];
  int local_914 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_908;
  undefined1 local_8a8 [65];
  undefined1 local_867 [2];
  undefined1 local_865;
  int local_864 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_858;
  undefined1 local_7f8 [68];
  int local_7b4 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_7a8;
  undefined1 local_748 [65];
  undefined1 local_707 [2];
  undefined1 local_705;
  int local_704 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_6f8;
  undefined1 local_698 [68];
  int local_654 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_648;
  undefined1 local_5e8 [65];
  undefined1 local_5a7 [2];
  undefined1 local_5a5;
  int local_5a4 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_598;
  undefined1 local_538 [68];
  int local_4f4 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_4e8;
  undefined1 local_488 [65];
  undefined1 local_447 [2];
  undefined1 local_445;
  int local_444 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_438;
  undefined1 local_3d8 [68];
  int local_394 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_388;
  undefined1 local_328 [65];
  undefined1 local_2e7 [2];
  undefined1 local_2e5;
  int local_2e4 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_2d8;
  undefined1 local_278 [68];
  int local_234 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_228;
  undefined1 local_1c8 [65];
  undefined1 local_187 [2];
  undefined1 local_185;
  int local_184 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_178;
  undefined1 local_118 [84];
  int local_c4;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_c0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_b8;
  undefined1 local_58 [78];
  undefined1 local_a [2];
  
  local_c0 = &local_b8;
  local_c4 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_c0,(char (*) [6])"alpha",&local_c4);
  local_58._0_8_ = &local_b8;
  local_58._8_8_ = 1;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_58 + 0x10),
             (basic_map<std::allocator<char>_> *)local_58._0_8_,init);
  local_184._4_8_ = &local_178;
  local_184[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_184._4_8_,(char (*) [5])"zulu",local_184);
  local_118._0_8_ = &local_178;
  local_118._8_8_ = 1;
  init_00._M_len = in_RCX;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_118 + 0x10),
             (basic_map<std::allocator<char>_> *)local_118._0_8_,init_00);
  local_a[0] = trial::dynamic::operator<
                         ((basic_variable<std::allocator<char>_> *)(local_58 + 0x10),
                          (basic_variable<std::allocator<char>_> *)(local_118 + 0x10));
  local_185 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({{\"alpha\", 1}}) < map::make({{\"zulu\", 1}})","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fb9,"void relational_suite::compare_map_with_map_string()",local_a,&local_185);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_118 + 0x10));
  local_1630 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_118;
  do {
    local_1630 = local_1630 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1630);
  } while (local_1630 != &local_178);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_58 + 0x10));
  ppVar1 = &local_b8;
  local_1648 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_58;
  do {
    local_1648 = local_1648 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1648);
  } while (local_1648 != ppVar1);
  local_234._4_8_ = &local_228;
  local_234[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_234._4_8_,(char (*) [6])"alpha",local_234);
  local_1c8._0_8_ = &local_228;
  local_1c8._8_8_ = 1;
  init_01._M_len = (size_type)ppVar1;
  init_01._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1c8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_1c8._0_8_,init_01);
  local_2e4._4_8_ = &local_2d8;
  local_2e4[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_2e4._4_8_,(char (*) [6])"alpha",local_2e4);
  local_278._0_8_ = &local_2d8;
  local_278._8_8_ = 1;
  init_02._M_len = (size_type)ppVar1;
  init_02._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_278 + 0x10),
             (basic_map<std::allocator<char>_> *)local_278._0_8_,init_02);
  local_187[0] = trial::dynamic::operator<
                           ((basic_variable<std::allocator<char>_> *)(local_1c8 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_278 + 0x10));
  local_2e5 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({{\"alpha\", 1}}) < map::make({{\"alpha\", 1}})","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fba,"void relational_suite::compare_map_with_map_string()",local_187,&local_2e5);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_278 + 0x10));
  local_1660 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_278;
  do {
    local_1660 = local_1660 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1660);
  } while (local_1660 != &local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1c8 + 0x10));
  ppVar1 = &local_228;
  local_1678 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1c8;
  do {
    local_1678 = local_1678 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1678);
  } while (local_1678 != ppVar1);
  local_394._4_8_ = &local_388;
  local_394[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_394._4_8_,(char (*) [6])"alpha",local_394);
  local_328._0_8_ = &local_388;
  local_328._8_8_ = 1;
  init_03._M_len = (size_type)ppVar1;
  init_03._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_328 + 0x10),
             (basic_map<std::allocator<char>_> *)local_328._0_8_,init_03);
  local_444._4_8_ = &local_438;
  local_444[0] = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_444._4_8_,(char (*) [6])"alpha",local_444);
  local_3d8._0_8_ = &local_438;
  local_3d8._8_8_ = 1;
  init_04._M_len = (size_type)ppVar1;
  init_04._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_3d8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_3d8._0_8_,init_04);
  local_2e7[0] = trial::dynamic::operator<
                           ((basic_variable<std::allocator<char>_> *)(local_328 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_3d8 + 0x10));
  local_445 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({{\"alpha\", 1}}) < map::make({{\"alpha\", 2}})","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fbb,"void relational_suite::compare_map_with_map_string()",local_2e7,&local_445);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_3d8 + 0x10));
  local_1690 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_3d8;
  do {
    local_1690 = local_1690 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1690);
  } while (local_1690 != &local_438);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_328 + 0x10));
  ppVar1 = &local_388;
  local_16a8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_328;
  do {
    local_16a8 = local_16a8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_16a8);
  } while (local_16a8 != ppVar1);
  local_4f4._4_8_ = &local_4e8;
  local_4f4[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_4f4._4_8_,(char (*) [5])"zulu",local_4f4);
  local_488._0_8_ = &local_4e8;
  local_488._8_8_ = 1;
  init_05._M_len = (size_type)ppVar1;
  init_05._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_488 + 0x10),
             (basic_map<std::allocator<char>_> *)local_488._0_8_,init_05);
  local_5a4._4_8_ = &local_598;
  local_5a4[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_5a4._4_8_,(char (*) [6])"alpha",local_5a4);
  local_538._0_8_ = &local_598;
  local_538._8_8_ = 1;
  init_06._M_len = (size_type)ppVar1;
  init_06._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_538 + 0x10),
             (basic_map<std::allocator<char>_> *)local_538._0_8_,init_06);
  local_447[0] = trial::dynamic::operator<
                           ((basic_variable<std::allocator<char>_> *)(local_488 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_538 + 0x10));
  local_5a5 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({{\"zulu\", 1}}) < map::make({{\"alpha\", 1}})","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fbc,"void relational_suite::compare_map_with_map_string()",local_447,&local_5a5);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_538 + 0x10));
  local_16c0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_538;
  do {
    local_16c0 = local_16c0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_16c0);
  } while (local_16c0 != &local_598);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_488 + 0x10));
  ppVar1 = &local_4e8;
  local_16d8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_488;
  do {
    local_16d8 = local_16d8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_16d8);
  } while (local_16d8 != ppVar1);
  local_654._4_8_ = &local_648;
  local_654[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_654._4_8_,(char (*) [6])"alpha",local_654);
  local_5e8._0_8_ = &local_648;
  local_5e8._8_8_ = 1;
  init_07._M_len = (size_type)ppVar1;
  init_07._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_5e8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_5e8._0_8_,init_07);
  local_704._4_8_ = &local_6f8;
  local_704[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_wchar_t_(&)[5],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_704._4_8_,(wchar_t (*) [5])L"zulu",local_704);
  local_698._0_8_ = &local_6f8;
  local_698._8_8_ = 1;
  init_08._M_len = (size_type)ppVar1;
  init_08._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_698 + 0x10),
             (basic_map<std::allocator<char>_> *)local_698._0_8_,init_08);
  local_5a7[0] = trial::dynamic::operator<
                           ((basic_variable<std::allocator<char>_> *)(local_5e8 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_698 + 0x10));
  local_705 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({{\"alpha\", 1}}) < map::make({{L\"zulu\", 1}})","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fc0,"void relational_suite::compare_map_with_map_string()",local_5a7,&local_705);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_698 + 0x10));
  local_16f0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_698;
  do {
    local_16f0 = local_16f0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_16f0);
  } while (local_16f0 != &local_6f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_5e8 + 0x10));
  ppVar1 = &local_648;
  local_1708 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_5e8;
  do {
    local_1708 = local_1708 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1708);
  } while (local_1708 != ppVar1);
  local_7b4._4_8_ = &local_7a8;
  local_7b4[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_7b4._4_8_,(char (*) [6])"alpha",local_7b4);
  local_748._0_8_ = &local_7a8;
  local_748._8_8_ = 1;
  init_09._M_len = (size_type)ppVar1;
  init_09._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_748 + 0x10),
             (basic_map<std::allocator<char>_> *)local_748._0_8_,init_09);
  local_864._4_8_ = &local_858;
  local_864[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_wchar_t_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_864._4_8_,(wchar_t (*) [6])L"alpha",local_864);
  local_7f8._0_8_ = &local_858;
  local_7f8._8_8_ = 1;
  init_10._M_len = (size_type)ppVar1;
  init_10._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_7f8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_7f8._0_8_,init_10);
  local_707[0] = trial::dynamic::operator<
                           ((basic_variable<std::allocator<char>_> *)(local_748 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_7f8 + 0x10));
  local_865 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({{\"alpha\", 1}}) < map::make({{L\"alpha\", 1}})","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fc1,"void relational_suite::compare_map_with_map_string()",local_707,&local_865);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_7f8 + 0x10));
  local_1720 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_7f8;
  do {
    local_1720 = local_1720 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1720);
  } while (local_1720 != &local_858);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_748 + 0x10));
  ppVar1 = &local_7a8;
  local_1738 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_748;
  do {
    local_1738 = local_1738 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1738);
  } while (local_1738 != ppVar1);
  local_914._4_8_ = &local_908;
  local_914[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_914._4_8_,(char (*) [6])"alpha",local_914);
  local_8a8._0_8_ = &local_908;
  local_8a8._8_8_ = 1;
  init_11._M_len = (size_type)ppVar1;
  init_11._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_8a8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_8a8._0_8_,init_11);
  local_9c4._4_8_ = &local_9b8;
  local_9c4[0] = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_wchar_t_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_9c4._4_8_,(wchar_t (*) [6])L"alpha",local_9c4);
  local_958._0_8_ = &local_9b8;
  local_958._8_8_ = 1;
  init_12._M_len = (size_type)ppVar1;
  init_12._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_958 + 0x10),
             (basic_map<std::allocator<char>_> *)local_958._0_8_,init_12);
  local_867[0] = trial::dynamic::operator<
                           ((basic_variable<std::allocator<char>_> *)(local_8a8 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_958 + 0x10));
  local_9c5 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({{\"alpha\", 1}}) < map::make({{L\"alpha\", 2}})","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fc2,"void relational_suite::compare_map_with_map_string()",local_867,&local_9c5);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_958 + 0x10));
  local_1750 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_958;
  do {
    local_1750 = local_1750 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1750);
  } while (local_1750 != &local_9b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_8a8 + 0x10));
  ppVar1 = &local_908;
  local_1768 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_8a8;
  do {
    local_1768 = local_1768 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1768);
  } while (local_1768 != ppVar1);
  local_a74._4_8_ = &local_a68;
  local_a74[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_a74._4_8_,(char (*) [5])"zulu",local_a74);
  local_a08._0_8_ = &local_a68;
  local_a08._8_8_ = 1;
  init_13._M_len = (size_type)ppVar1;
  init_13._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_a08 + 0x10),
             (basic_map<std::allocator<char>_> *)local_a08._0_8_,init_13);
  local_b24._4_8_ = &local_b18;
  local_b24[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_wchar_t_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_b24._4_8_,(wchar_t (*) [6])L"alpha",local_b24);
  local_ab8._0_8_ = &local_b18;
  local_ab8._8_8_ = 1;
  init_14._M_len = (size_type)ppVar1;
  init_14._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_ab8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_ab8._0_8_,init_14);
  local_9c7[0] = trial::dynamic::operator<
                           ((basic_variable<std::allocator<char>_> *)(local_a08 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_ab8 + 0x10));
  local_b25 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({{\"zulu\", 1}}) < map::make({{L\"alpha\", 1}})","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fc3,"void relational_suite::compare_map_with_map_string()",local_9c7,&local_b25);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_ab8 + 0x10));
  local_1780 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_ab8;
  do {
    local_1780 = local_1780 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1780);
  } while (local_1780 != &local_b18);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_a08 + 0x10));
  ppVar1 = &local_a68;
  local_1798 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_a08;
  do {
    local_1798 = local_1798 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1798);
  } while (local_1798 != ppVar1);
  local_bd4._4_8_ = &local_bc8;
  local_bd4[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_bd4._4_8_,(char (*) [6])"alpha",local_bd4);
  local_b68._0_8_ = &local_bc8;
  local_b68._8_8_ = 1;
  init_15._M_len = (size_type)ppVar1;
  init_15._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_b68 + 0x10),
             (basic_map<std::allocator<char>_> *)local_b68._0_8_,init_15);
  local_c84._4_8_ = &local_c78;
  local_c84[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char16_t_(&)[5],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_c84._4_8_,(char16_t (*) [5])L"zulu",local_c84);
  local_c18._0_8_ = &local_c78;
  local_c18._8_8_ = 1;
  init_16._M_len = (size_type)ppVar1;
  init_16._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_c18 + 0x10),
             (basic_map<std::allocator<char>_> *)local_c18._0_8_,init_16);
  local_b27[0] = trial::dynamic::operator<
                           ((basic_variable<std::allocator<char>_> *)(local_b68 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_c18 + 0x10));
  local_c85 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({{\"alpha\", 1}}) < map::make({{u\"zulu\", 1}})","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fc7,"void relational_suite::compare_map_with_map_string()",local_b27,&local_c85);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_c18 + 0x10));
  local_17b0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_c18;
  do {
    local_17b0 = local_17b0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_17b0);
  } while (local_17b0 != &local_c78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_b68 + 0x10));
  ppVar1 = &local_bc8;
  local_17c8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_b68;
  do {
    local_17c8 = local_17c8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_17c8);
  } while (local_17c8 != ppVar1);
  local_d34._4_8_ = &local_d28;
  local_d34[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_d34._4_8_,(char (*) [6])"alpha",local_d34);
  local_cc8._0_8_ = &local_d28;
  local_cc8._8_8_ = 1;
  init_17._M_len = (size_type)ppVar1;
  init_17._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_cc8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_cc8._0_8_,init_17);
  local_de4._4_8_ = &local_dd8;
  local_de4[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char16_t_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_de4._4_8_,(char16_t (*) [6])L"alpha",local_de4);
  local_d78._0_8_ = &local_dd8;
  local_d78._8_8_ = 1;
  init_18._M_len = (size_type)ppVar1;
  init_18._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_d78 + 0x10),
             (basic_map<std::allocator<char>_> *)local_d78._0_8_,init_18);
  local_c87[0] = trial::dynamic::operator<
                           ((basic_variable<std::allocator<char>_> *)(local_cc8 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_d78 + 0x10));
  local_de5 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({{\"alpha\", 1}}) < map::make({{u\"alpha\", 1}})","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fc8,"void relational_suite::compare_map_with_map_string()",local_c87,&local_de5);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_d78 + 0x10));
  local_17e0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_d78;
  do {
    local_17e0 = local_17e0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_17e0);
  } while (local_17e0 != &local_dd8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_cc8 + 0x10));
  ppVar1 = &local_d28;
  local_17f8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_cc8;
  do {
    local_17f8 = local_17f8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_17f8);
  } while (local_17f8 != ppVar1);
  local_e94._4_8_ = &local_e88;
  local_e94[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_e94._4_8_,(char (*) [6])"alpha",local_e94);
  local_e28._0_8_ = &local_e88;
  local_e28._8_8_ = 1;
  init_19._M_len = (size_type)ppVar1;
  init_19._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_e28 + 0x10),
             (basic_map<std::allocator<char>_> *)local_e28._0_8_,init_19);
  local_f44._4_8_ = &local_f38;
  local_f44[0] = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char16_t_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_f44._4_8_,(char16_t (*) [6])L"alpha",local_f44);
  local_ed8._0_8_ = &local_f38;
  local_ed8._8_8_ = 1;
  init_20._M_len = (size_type)ppVar1;
  init_20._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_ed8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_ed8._0_8_,init_20);
  local_de7[0] = trial::dynamic::operator<
                           ((basic_variable<std::allocator<char>_> *)(local_e28 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_ed8 + 0x10));
  local_f45 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({{\"alpha\", 1}}) < map::make({{u\"alpha\", 2}})","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fc9,"void relational_suite::compare_map_with_map_string()",local_de7,&local_f45);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_ed8 + 0x10));
  local_1810 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_ed8;
  do {
    local_1810 = local_1810 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1810);
  } while (local_1810 != &local_f38);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_e28 + 0x10));
  ppVar1 = &local_e88;
  local_1828 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_e28;
  do {
    local_1828 = local_1828 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1828);
  } while (local_1828 != ppVar1);
  local_ff4._4_8_ = &local_fe8;
  local_ff4[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_ff4._4_8_,(char (*) [5])"zulu",local_ff4);
  local_f88._0_8_ = &local_fe8;
  local_f88._8_8_ = 1;
  init_21._M_len = (size_type)ppVar1;
  init_21._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_f88 + 0x10),
             (basic_map<std::allocator<char>_> *)local_f88._0_8_,init_21);
  local_10a4._4_8_ = &local_1098;
  local_10a4[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char16_t_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_10a4._4_8_,(char16_t (*) [6])L"alpha",local_10a4);
  local_1038._0_8_ = &local_1098;
  local_1038._8_8_ = 1;
  init_22._M_len = (size_type)ppVar1;
  init_22._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1038 + 0x10),
             (basic_map<std::allocator<char>_> *)local_1038._0_8_,init_22);
  local_f47[0] = trial::dynamic::operator<
                           ((basic_variable<std::allocator<char>_> *)(local_f88 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_1038 + 0x10));
  local_10a5 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({{\"zulu\", 1}}) < map::make({{u\"alpha\", 1}})","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fca,"void relational_suite::compare_map_with_map_string()",local_f47,&local_10a5);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1038 + 0x10));
  local_1840 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1038;
  do {
    local_1840 = local_1840 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1840);
  } while (local_1840 != &local_1098);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_f88 + 0x10));
  ppVar1 = &local_fe8;
  local_1858 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_f88;
  do {
    local_1858 = local_1858 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1858);
  } while (local_1858 != ppVar1);
  local_1154._4_8_ = &local_1148;
  local_1154[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_1154._4_8_,(char (*) [6])"alpha",local_1154);
  local_10e8._0_8_ = &local_1148;
  local_10e8._8_8_ = 1;
  init_23._M_len = (size_type)ppVar1;
  init_23._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_10e8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_10e8._0_8_,init_23);
  local_1204._4_8_ = &local_11f8;
  local_1204[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char32_t_(&)[5],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_1204._4_8_,(char32_t (*) [5])L"zulu",local_1204);
  local_1198._0_8_ = &local_11f8;
  local_1198._8_8_ = 1;
  init_24._M_len = (size_type)ppVar1;
  init_24._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1198 + 0x10),
             (basic_map<std::allocator<char>_> *)local_1198._0_8_,init_24);
  local_10a7[0] =
       trial::dynamic::operator<
                 ((basic_variable<std::allocator<char>_> *)(local_10e8 + 0x10),
                  (basic_variable<std::allocator<char>_> *)(local_1198 + 0x10));
  local_1205 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({{\"alpha\", 1}}) < map::make({{U\"zulu\", 1}})","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fce,"void relational_suite::compare_map_with_map_string()",local_10a7,&local_1205);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1198 + 0x10));
  local_1870 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1198;
  do {
    local_1870 = local_1870 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1870);
  } while (local_1870 != &local_11f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_10e8 + 0x10));
  ppVar1 = &local_1148;
  local_1888 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_10e8;
  do {
    local_1888 = local_1888 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1888);
  } while (local_1888 != ppVar1);
  local_12b4._4_8_ = &local_12a8;
  local_12b4[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_12b4._4_8_,(char (*) [6])"alpha",local_12b4);
  local_1248._0_8_ = &local_12a8;
  local_1248._8_8_ = 1;
  init_25._M_len = (size_type)ppVar1;
  init_25._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1248 + 0x10),
             (basic_map<std::allocator<char>_> *)local_1248._0_8_,init_25);
  local_1364._4_8_ = &local_1358;
  local_1364[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char32_t_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_1364._4_8_,(char32_t (*) [6])L"alpha",local_1364);
  local_12f8._0_8_ = &local_1358;
  local_12f8._8_8_ = 1;
  init_26._M_len = (size_type)ppVar1;
  init_26._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_12f8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_12f8._0_8_,init_26);
  local_1207[0] =
       trial::dynamic::operator<
                 ((basic_variable<std::allocator<char>_> *)(local_1248 + 0x10),
                  (basic_variable<std::allocator<char>_> *)(local_12f8 + 0x10));
  local_1365 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({{\"alpha\", 1}}) < map::make({{U\"alpha\", 1}})","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fcf,"void relational_suite::compare_map_with_map_string()",local_1207,&local_1365);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_12f8 + 0x10));
  local_18a0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_12f8;
  do {
    local_18a0 = local_18a0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_18a0);
  } while (local_18a0 != &local_1358);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1248 + 0x10));
  ppVar1 = &local_12a8;
  local_18b8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1248;
  do {
    local_18b8 = local_18b8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_18b8);
  } while (local_18b8 != ppVar1);
  local_1414._4_8_ = &local_1408;
  local_1414[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_1414._4_8_,(char (*) [6])"alpha",local_1414);
  local_13a8._0_8_ = &local_1408;
  local_13a8._8_8_ = 1;
  init_27._M_len = (size_type)ppVar1;
  init_27._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_13a8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_13a8._0_8_,init_27);
  local_14c4._4_8_ = &local_14b8;
  local_14c4[0] = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char32_t_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_14c4._4_8_,(char32_t (*) [6])L"alpha",local_14c4);
  local_1458._0_8_ = &local_14b8;
  local_1458._8_8_ = 1;
  init_28._M_len = (size_type)ppVar1;
  init_28._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1458 + 0x10),
             (basic_map<std::allocator<char>_> *)local_1458._0_8_,init_28);
  local_1367[0] =
       trial::dynamic::operator<
                 ((basic_variable<std::allocator<char>_> *)(local_13a8 + 0x10),
                  (basic_variable<std::allocator<char>_> *)(local_1458 + 0x10));
  local_14c5 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({{\"alpha\", 1}}) < map::make({{U\"alpha\", 2}})","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fd0,"void relational_suite::compare_map_with_map_string()",local_1367,&local_14c5);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1458 + 0x10));
  local_18d0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1458;
  do {
    local_18d0 = local_18d0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_18d0);
  } while (local_18d0 != &local_14b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_13a8 + 0x10));
  ppVar1 = &local_1408;
  local_18e8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_13a8;
  do {
    local_18e8 = local_18e8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_18e8);
  } while (local_18e8 != ppVar1);
  local_1574._4_8_ = &local_1568;
  local_1574[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_1574._4_8_,(char (*) [5])"zulu",local_1574);
  local_1508._0_8_ = &local_1568;
  local_1508._8_8_ = 1;
  init_29._M_len = (size_type)ppVar1;
  init_29._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1508 + 0x10),
             (basic_map<std::allocator<char>_> *)local_1508._0_8_,init_29);
  local_1620 = &local_1618;
  local_1624 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char32_t_(&)[6],_int,_true>(local_1620,(char32_t (*) [6])L"alpha",&local_1624);
  local_15b8._0_8_ = &local_1618;
  local_15b8._8_8_ = 1;
  init_30._M_len = (size_type)ppVar1;
  init_30._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_15b8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_15b8._0_8_,init_30);
  local_14c7[0] =
       trial::dynamic::operator<
                 ((basic_variable<std::allocator<char>_> *)(local_1508 + 0x10),
                  (basic_variable<std::allocator<char>_> *)(local_15b8 + 0x10));
  local_1625 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({{\"zulu\", 1}}) < map::make({{U\"alpha\", 1}})","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fd1,"void relational_suite::compare_map_with_map_string()",local_14c7,&local_1625);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_15b8 + 0x10));
  local_1900 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_15b8;
  do {
    local_1900 = local_1900 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1900);
  } while (local_1900 != &local_1618);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1508 + 0x10));
  local_1918 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1508;
  do {
    local_1918 = local_1918 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1918);
  } while (local_1918 != &local_1568);
  return;
}

Assistant:

void compare_map_with_map_string()
{
    // map string - map string
    {
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({{"alpha", 1}}) < map::make({{"zulu", 1}}), true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({{"alpha", 1}}) < map::make({{"alpha", 1}}), false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({{"alpha", 1}}) < map::make({{"alpha", 2}}), true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({{"zulu", 1}}) < map::make({{"alpha", 1}}), false);
    }
    // map string - map wstring
    {
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({{"alpha", 1}}) < map::make({{L"zulu", 1}}), true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({{"alpha", 1}}) < map::make({{L"alpha", 1}}), true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({{"alpha", 1}}) < map::make({{L"alpha", 2}}), true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({{"zulu", 1}}) < map::make({{L"alpha", 1}}), true);
    }
    // map string - map u16string
    {
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({{"alpha", 1}}) < map::make({{u"zulu", 1}}), true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({{"alpha", 1}}) < map::make({{u"alpha", 1}}), true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({{"alpha", 1}}) < map::make({{u"alpha", 2}}), true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({{"zulu", 1}}) < map::make({{u"alpha", 1}}), true);
    }
    // map string - map u32string
    {
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({{"alpha", 1}}) < map::make({{U"zulu", 1}}), true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({{"alpha", 1}}) < map::make({{U"alpha", 1}}), true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({{"alpha", 1}}) < map::make({{U"alpha", 2}}), true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({{"zulu", 1}}) < map::make({{U"alpha", 1}}), true);
    }
}